

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

void Scl_LibertyReadWireLoad(Scl_Tree_t *p,Vec_Str_t *vOut)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Scl_Item_t *pSVar5;
  Scl_Item_t *pSVar6;
  double dVar7;
  
  iVar2 = Scl_LibertyItemNum(p,p->pItems,"wire_load");
  Vec_StrPutI_(vOut,iVar2);
  pSVar5 = p->pItems;
  uVar1 = pSVar5->Child;
  if ((int)uVar1 < p->nItems) {
    if (pSVar5 != (Scl_Item_t *)0x0 && -1 < (int)uVar1) {
      pSVar5 = pSVar5 + uVar1;
      do {
        iVar2 = (pSVar5->Key).Beg;
        iVar3 = (pSVar5->Key).End - iVar2;
        iVar2 = strncmp(p->pContents + iVar2,"wire_load",(long)iVar3);
        if (iVar3 == 9 && iVar2 == 0) {
          pcVar4 = Scl_LibertyReadString(p,pSVar5->Head);
          Vec_StrPutS_(vOut,pcVar4);
          uVar1 = pSVar5->Child;
          while( true ) {
            if (p->nItems <= (int)uVar1) goto LAB_003e60e8;
            if ((int)uVar1 < 0) {
              pSVar6 = (Scl_Item_t *)0x0;
            }
            else {
              pSVar6 = p->pItems + uVar1;
            }
            if (pSVar6 == (Scl_Item_t *)0x0) break;
            iVar2 = (pSVar6->Key).Beg;
            iVar3 = (pSVar6->Key).End - iVar2;
            iVar2 = strncmp(p->pContents + iVar2,"capacitance",(long)iVar3);
            if (iVar3 == 0xb && iVar2 == 0) {
              pcVar4 = Scl_LibertyReadString(p,pSVar6->Head);
              dVar7 = atof(pcVar4);
              Vec_StrPutF_(vOut,(float)dVar7);
            }
            uVar1 = pSVar6->Next;
          }
          uVar1 = pSVar5->Child;
          while( true ) {
            if (p->nItems <= (int)uVar1) goto LAB_003e60e8;
            if ((int)uVar1 < 0) {
              pSVar6 = (Scl_Item_t *)0x0;
            }
            else {
              pSVar6 = p->pItems + uVar1;
            }
            if (pSVar6 == (Scl_Item_t *)0x0) break;
            iVar2 = (pSVar6->Key).Beg;
            iVar3 = (pSVar6->Key).End - iVar2;
            iVar2 = strncmp(p->pContents + iVar2,"slope",(long)iVar3);
            if (iVar3 == 5 && iVar2 == 0) {
              pcVar4 = Scl_LibertyReadString(p,pSVar6->Head);
              dVar7 = atof(pcVar4);
              Vec_StrPutF_(vOut,(float)dVar7);
            }
            uVar1 = pSVar6->Next;
          }
          iVar2 = Scl_LibertyItemNum(p,pSVar5,"fanout_length");
          Vec_StrPutI_(vOut,iVar2);
          uVar1 = pSVar5->Child;
          while( true ) {
            if (p->nItems <= (int)uVar1) goto LAB_003e60e8;
            if ((int)uVar1 < 0) {
              pSVar6 = (Scl_Item_t *)0x0;
            }
            else {
              pSVar6 = p->pItems + uVar1;
            }
            if (pSVar6 == (Scl_Item_t *)0x0) break;
            iVar2 = (pSVar6->Key).Beg;
            iVar3 = (pSVar6->Key).End - iVar2;
            iVar2 = strncmp(p->pContents + iVar2,"fanout_length",(long)iVar3);
            if (iVar3 == 0xd && iVar2 == 0) {
              pcVar4 = Scl_LibertyReadString(p,pSVar6->Head);
              pcVar4 = strtok(pcVar4," ,");
              iVar2 = atoi(pcVar4);
              pcVar4 = strtok((char *)0x0," ");
              dVar7 = atof(pcVar4);
              Vec_StrPutI_(vOut,iVar2);
              Vec_StrPutF_(vOut,(float)dVar7);
            }
            uVar1 = pSVar6->Next;
          }
        }
        uVar1 = pSVar5->Next;
        if (p->nItems <= (int)uVar1) goto LAB_003e60e8;
        if ((int)uVar1 < 0) {
          pSVar5 = (Scl_Item_t *)0x0;
        }
        else {
          pSVar5 = p->pItems + uVar1;
        }
      } while (pSVar5 != (Scl_Item_t *)0x0);
    }
    return;
  }
LAB_003e60e8:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLiberty.c"
                ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

void Scl_LibertyReadWireLoad( Scl_Tree_t * p, Vec_Str_t * vOut )
{
    Scl_Item_t * pItem, * pChild;
    Vec_StrPutI_( vOut, Scl_LibertyItemNum(p, Scl_LibertyRoot(p), "wire_load") );
    Vec_StrPut_( vOut );
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "wire_load" )
    {
        Vec_StrPutS_( vOut, Scl_LibertyReadString(p, pItem->Head) );
        Scl_ItemForEachChildName( p, pItem, pChild, "capacitance" )
            Vec_StrPutF_( vOut, atof(Scl_LibertyReadString(p, pChild->Head)) );
        Scl_ItemForEachChildName( p, pItem, pChild, "slope" )
            Vec_StrPutF_( vOut, atof(Scl_LibertyReadString(p, pChild->Head)) );
        Vec_StrPut_( vOut );
        Vec_StrPutI_( vOut, Scl_LibertyItemNum(p, pItem, "fanout_length") );
        Vec_StrPut_( vOut );
        Scl_ItemForEachChildName( p, pItem, pChild, "fanout_length" )
        {
            char * pHead  = Scl_LibertyReadString(p, pChild->Head);
            int    First  = atoi( strtok(pHead, " ,") );
            float  Second = atof( strtok(NULL, " ") );
            Vec_StrPutI_( vOut, First );
            Vec_StrPutF_( vOut, Second );
            Vec_StrPut_( vOut );
        }
        Vec_StrPut_( vOut );
    }
    Vec_StrPut_( vOut );
}